

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Logger.cpp
# Opt level: O2

void higan::Logger::SetLogToConsole(void)

{
  if (g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
      (element_type *)0x0) {
    std::__shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>::reset
              (&g_log_file.super___shared_ptr<higan::LogFile,_(__gnu_cxx::_Lock_policy)2>);
    return;
  }
  return;
}

Assistant:

void Logger::SetLogToConsole()
{
	if (g_log_file)
	{
		g_log_file.reset();
	}
}